

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  int iVar2;
  char *pcVar3;
  ValidationErrorHandler errorHandler;
  
  if (argc < 2) {
    printHelpText();
    return 0;
  }
  ValidationErrorHandler::ValidationErrorHandler(&errorHandler);
  parse(argv[1],&errorHandler);
  if (errorHandler.mFileNotFound == true) {
    printHelpText();
    iVar2 = -2;
    goto LAB_006846bf;
  }
  if (errorHandler.mHasHandledSaxParserError != false) {
    iVar2 = -1;
    goto LAB_006846bf;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"\"");
  poVar1 = std::operator<<(poVar1,argv[1]);
  std::operator<<(poVar1,"\" is valid against the COLLADA ");
  if (version == COLLADA_14) {
    pcVar3 = "1.4.1";
LAB_00684696:
    std::operator<<((ostream *)&std::cout,pcVar3);
  }
  else if (version == COLLADA_15) {
    pcVar3 = "1.5.0";
    goto LAB_00684696;
  }
  poVar1 = std::operator<<((ostream *)&std::cout," schema.");
  iVar2 = 0;
  std::endl<char,std::char_traits<char>>(poVar1);
LAB_006846bf:
  ValidationErrorHandler::~ValidationErrorHandler(&errorHandler);
  return iVar2;
}

Assistant:

int main(int argc, char* argv[]) 
{
	if ( argc > 1 ) 
	{
		ValidationErrorHandler errorHandler;

		parse( argv[1], errorHandler);

		if ( errorHandler.getFileNotFound() )
		{
			printHelpText();
			return -2;
		} 
		
		if ( errorHandler.hasHandledSaxParserError() )
		{
			return -1;
		}
		else
		{
			std::cout << "\"" << argv[1]<< "\" is valid against the COLLADA ";
			switch ( version )
			{
			case COLLADASaxFWL::COLLADA_14:
				std::cout << "1.4.1";
				break;
			case COLLADASaxFWL::COLLADA_15:
				std::cout << "1.5.0";
				break;
			}
			std::cout << " schema." << std::endl;
			return 0;
		}
	}
	else
	{
		printHelpText();
		return 0;
	}

}